

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O3

void __thiscall dg::SubgraphNode<dg::pta::PSNode>::isolate(SubgraphNode<dg::pta::PSNode> *this)

{
  PSNode *pPVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  pointer ppPVar5;
  PSNode *n;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_58;
  pointer local_40;
  PSNode *local_38;
  
  ppPVar4 = (this->_predecessors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (this->_predecessors).
             super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppPVar4 != local_40) {
    do {
      pPVar1 = *ppPVar4;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
                (&local_58,
                 (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      ppPVar3 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppPVar5 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppPVar3 != ppPVar5) {
        do {
          local_38 = *ppPVar3;
          if (local_38 == (PSNode *)0x0 || &local_38->super_SubgraphNode<dg::pta::PSNode> != this) {
            if (local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
              _M_realloc_insert<dg::pta::PSNode*const&>
                        ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_38);
            }
            else {
              *local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish = local_38;
              local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_58.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          ppPVar3 = ppPVar3 + 1;
        } while (ppPVar3 != ppPVar5);
        ppPVar3 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppPVar5 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppPVar2 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._successors.
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppPVar3;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppPVar5;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppPVar2;
      if (ppPVar3 != (pointer)0x0) {
        operator_delete(ppPVar3,(long)ppPVar2 - (long)ppPVar3);
      }
      ppPVar4 = ppPVar4 + 1;
    } while (ppPVar4 != local_40);
  }
  ppPVar4 = (this->_successors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (this->_successors).
             super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppPVar4 != local_40) {
    do {
      pPVar1 = *ppPVar4;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
                (&local_58,
                 (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      ppPVar3 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppPVar5 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppPVar3 != ppPVar5) {
        do {
          local_38 = *ppPVar3;
          if (local_38 == (PSNode *)0x0 || &local_38->super_SubgraphNode<dg::pta::PSNode> != this) {
            if (local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
              _M_realloc_insert<dg::pta::PSNode*const&>
                        ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_38);
            }
            else {
              *local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish = local_38;
              local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_58.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          ppPVar3 = ppPVar3 + 1;
        } while (ppPVar3 != ppPVar5);
        ppPVar3 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppPVar5 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppPVar2 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pPVar1->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppPVar3;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppPVar5;
      local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppPVar2;
      if (ppPVar3 != (pointer)0x0) {
        operator_delete(ppPVar3,(long)ppPVar2 - (long)ppPVar3);
      }
      ppPVar4 = ppPVar4 + 1;
    } while (ppPVar4 != local_40);
  }
  ppPVar3 = (this->_predecessors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar4 = (this->_predecessors).
                 super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar4 != ppPVar3; ppPVar4 = ppPVar4 + 1) {
    ppPVar5 = (this->_successors).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppPVar2 = (this->_successors).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppPVar5 != ppPVar2) {
      pPVar1 = *ppPVar4;
      do {
        addSuccessor(&pPVar1->super_SubgraphNode<dg::pta::PSNode>,*ppPVar5);
        ppPVar5 = ppPVar5 + 1;
      } while (ppPVar5 != ppPVar2);
    }
  }
  ppPVar4 = (this->_successors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_successors).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar4) {
    (this->_successors).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar4;
  }
  ppPVar4 = (this->_predecessors).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_predecessors).
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar4) {
    (this->_predecessors).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar4;
  }
  return;
}

Assistant:

void isolate() {
        // Remove this node from successors of the predecessors
        for (NodeT *pred : _predecessors) {
            std::vector<NodeT *> new_succs;
            new_succs.reserve(pred->_successors.size());

            for (NodeT *n : pred->_successors) {
                if (n != this)
                    new_succs.push_back(n);
            }

            new_succs.swap(pred->_successors);
        }

        // remove this nodes from successors' predecessors
        for (NodeT *succ : _successors) {
            std::vector<NodeT *> new_preds;
            new_preds.reserve(succ->_predecessors.size());

            for (NodeT *n : succ->_predecessors) {
                if (n != this)
                    new_preds.push_back(n);
            }

            new_preds.swap(succ->_predecessors);
        }

        // Take every predecessor and connect it to every successor.
        for (NodeT *pred : _predecessors) {
            for (NodeT *succ : _successors) {
                assert(succ != this && "Self-loop");
                pred->addSuccessor(succ);
            }
        }

        _successors.clear();
        _predecessors.clear();
    }